

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexData(MeshGeometry *this,string *type,int index,Scope *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer piVar3;
  int iVar4;
  Element *pEVar5;
  Token *pTVar6;
  const_iterator cVar7;
  Token *t;
  Token *t_00;
  long lVar8;
  Token *t_01;
  undefined1 auVar9 [8];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"MappingInformationType","");
  pEVar5 = GetRequiredElement(source,(string *)local_1a8,(Element *)0x0);
  pTVar6 = GetRequiredToken(pEVar5,0);
  ParseTokenAsString_abi_cxx11_(&local_1c8,(FBX *)pTVar6,t);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8);
  }
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ReferenceInformationType","")
  ;
  pEVar5 = GetRequiredElement(source,(string *)local_1a8,(Element *)0x0);
  pTVar6 = GetRequiredToken(pEVar5,0);
  ParseTokenAsString_abi_cxx11_(&local_1e8,(FBX *)pTVar6,t_00);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8);
  }
  iVar4 = std::__cxx11::string::compare((char *)type);
  if (iVar4 == 0) {
    if (index < 8) {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Name","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                      *)source,(key_type *)local_1a8);
      if ((_Rb_tree_header *)cVar7._M_node == &(source->elements)._M_t._M_impl.super__Rb_tree_header
         ) {
        pEVar5 = (Element *)0x0;
      }
      else {
        pEVar5 = *(Element **)(cVar7._M_node + 2);
      }
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8);
      }
      std::__cxx11::string::_M_replace
                ((ulong)(this->m_uvNames + index),0,(char *)this->m_uvNames[index]._M_string_length,
                 0x22edf5);
      if (pEVar5 != (Element *)0x0) {
        pTVar6 = GetRequiredToken(pEVar5,0);
        ParseTokenAsString_abi_cxx11_((string *)local_1a8,(FBX *)pTVar6,t_01);
        std::__cxx11::string::operator=((string *)(this->m_uvNames + index),(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8);
        }
      }
      ResolveVertexDataArray<aiVector2t<float>>
                (this->m_uvs + index,source,&local_1c8,&local_1e8,"UV","UVIndex",
                 ((long)(this->m_vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                 &this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
      goto LAB_001898f1;
    }
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [60])"ignoring UV layer, maximum number of UV channels exceeded: ");
    std::ostream::operator<<((ostream *)local_1a8,index);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (limit is ",0xb);
    std::ostream::operator<<((ostream *)local_1a8,8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
    LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
LAB_001896ba:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)type);
    if (iVar4 == 0) {
      if ((this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1a8 = (undefined1  [8])0x0;
        paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_198[0]._M_allocated_capacity = (pointer)0x0;
        ReadVertexDataMaterials
                  (this,(vector<int,_std::allocator<int>_> *)local_1a8,source,&local_1c8,&local_1e8)
        ;
        lVar8 = 0;
        for (auVar9 = local_1a8; auVar9 != (undefined1  [8])paStack_1a0;
            auVar9 = (undefined1  [8])((long)auVar9 + 4)) {
          lVar8 = lVar8 + (ulong)(*(uint *)auVar9 >> 0x1f);
        }
        if (lVar8 == (long)paStack_1a0 - (long)local_1a8 >> 2) {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x1897df);
        }
        else {
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          piVar3 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)paStack_1a0;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_198[0]._0_8_;
          local_1a8 = (undefined1  [8])paVar1;
          paStack_1a0 = paVar2;
          local_198[0]._0_8_ = piVar3;
        }
        if (local_1a8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1a8);
        }
        goto LAB_001898f1;
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)type);
      if (iVar4 == 0) {
        if ((this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ResolveVertexDataArray<aiVector3t<float>>
                    (&this->m_normals,source,&local_1c8,&local_1e8,"Normals","NormalsIndex",
                     ((long)(this->m_vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                     &this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
          goto LAB_001898f1;
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)type);
        if (iVar4 == 0) {
          if ((this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataTangents(this,&this->m_tangents,source,&local_1c8,&local_1e8);
            goto LAB_001898f1;
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)type);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)type);
            if (iVar4 != 0) goto LAB_001898f1;
            if (index < 8) {
              ReadVertexDataColors(this,this->m_colors + index,source,&local_1c8,&local_1e8);
              goto LAB_001898f1;
            }
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[69]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [69])
                       "ignoring vertex color layer, maximum number of color sets exceeded: ");
            std::ostream::operator<<((ostream *)local_1a8,index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," (limit is ",0xb);
            std::ostream::operator<<((ostream *)local_1a8,8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
            goto LAB_001896ba;
          }
          if ((this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataBinormals(this,&this->m_binormals,source,&local_1c8,&local_1e8);
            goto LAB_001898f1;
          }
        }
      }
    }
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x1898f1);
  }
LAB_001898f1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MeshGeometry::ReadVertexData(const std::string& type, int index, const Scope& source)
{
    const std::string& MappingInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"MappingInformationType"),0)
    );

    const std::string& ReferenceInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"ReferenceInformationType"),0)
    );

    if (type == "LayerElementUV") {
        if(index >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {
            FBXImporter::LogError(Formatter::format("ignoring UV layer, maximum number of UV channels exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_TEXTURECOORDS << ")" );
            return;
        }

        const Element* Name = source["Name"];
        m_uvNames[index] = "";
        if(Name) {
            m_uvNames[index] = ParseTokenAsString(GetRequiredToken(*Name,0));
        }

        ReadVertexDataUV(m_uvs[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementMaterial") {
        if (m_materials.size() > 0) {
            FBXImporter::LogError("ignoring additional material layer");
            return;
        }

        std::vector<int> temp_materials;

        ReadVertexDataMaterials(temp_materials,source,
            MappingInformationType,
            ReferenceInformationType
        );

        // sometimes, there will be only negative entries. Drop the material
        // layer in such a case (I guess it means a default material should
        // be used). This is what the converter would do anyway, and it
        // avoids losing the material if there are more material layers
        // coming of which at least one contains actual data (did observe
        // that with one test file).
        const size_t count_neg = std::count_if(temp_materials.begin(),temp_materials.end(),[](int n) { return n < 0; });
        if(count_neg == temp_materials.size()) {
            FBXImporter::LogWarn("ignoring dummy material layer (all entries -1)");
            return;
        }

        std::swap(temp_materials, m_materials);
    }
    else if (type == "LayerElementNormal") {
        if (m_normals.size() > 0) {
            FBXImporter::LogError("ignoring additional normal layer");
            return;
        }

        ReadVertexDataNormals(m_normals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementTangent") {
        if (m_tangents.size() > 0) {
            FBXImporter::LogError("ignoring additional tangent layer");
            return;
        }

        ReadVertexDataTangents(m_tangents,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementBinormal") {
        if (m_binormals.size() > 0) {
            FBXImporter::LogError("ignoring additional binormal layer");
            return;
        }

        ReadVertexDataBinormals(m_binormals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementColor") {
        if(index >= AI_MAX_NUMBER_OF_COLOR_SETS) {
            FBXImporter::LogError(Formatter::format("ignoring vertex color layer, maximum number of color sets exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_COLOR_SETS << ")" );
            return;
        }

        ReadVertexDataColors(m_colors[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
}